

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::generateRandomCameraSystem
               (int numberCameras,translations_t *camOffsets,rotations_t *camRotations)

{
  pointer *ppMVar1;
  pointer *ppMVar2;
  iterator __position;
  iterator __position_00;
  translation_t camOffset;
  rotation_t camRotation;
  Vector3d local_88;
  Matrix<double,_3,_3,_0,_3,_3> local_70;
  
  if (0 < numberCameras) {
    do {
      generateRandomDirectionTranslation(&local_88,0.5);
      generateRandomRotation();
      __position._M_current =
           (camOffsets->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (camOffsets->
          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)camOffsets,__position,&local_88);
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[2] =
             local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[2];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[0] =
             local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[0];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
        m_storage.m_data.array[1] =
             local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[1];
        ppMVar1 = &(camOffsets->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
      __position_00._M_current =
           (camRotations->
           super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (camRotations->
          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
                  ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                    *)camRotations,__position_00,&local_70);
      }
      else {
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[8] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[8];
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[0] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[0];
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[1] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[1];
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[2] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[2];
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[3] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[3];
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[4] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[4];
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[5] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[5];
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[6] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[6];
        ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[7] =
             local_70.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
             array[7];
        ppMVar2 = &(camRotations->
                   super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppMVar2 = *ppMVar2 + 1;
      }
      numberCameras = numberCameras + -1;
    } while (numberCameras != 0);
  }
  return;
}

Assistant:

void
opengv::generateRandomCameraSystem(
    int numberCameras,
    translations_t & camOffsets,
    rotations_t & camRotations )
{
  double offset = 0.5; //this is the distance from the viewpoint origin

  for( int i = 0; i < numberCameras; i++ )
  {
    translation_t camOffset = generateRandomDirectionTranslation(offset);
    rotation_t camRotation = generateRandomRotation();
    camOffsets.push_back(camOffset);
    camRotations.push_back(camRotation);
  }
}